

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

ray * __thiscall camera::get_ray(ray *__return_storage_ptr__,camera *this,double s,double t)

{
  double dVar1;
  vec3 local_140;
  vec3 local_128;
  vec3 local_110;
  vec3 local_f8;
  vec3 local_e0;
  vec3 local_c8;
  vec3 local_b0;
  vec3 local_98;
  vec3 local_80;
  undefined1 local_68 [8];
  vec3 offset;
  undefined1 local_38 [8];
  vec3 rd;
  double t_local;
  double s_local;
  camera *this_local;
  
  dVar1 = this->lens_radius;
  rd.e[2] = t;
  random_in_unit_disk();
  operator*((vec3 *)local_38,dVar1,(vec3 *)(offset.e + 2));
  dVar1 = vec3::x((vec3 *)local_38);
  operator*(&local_80,&this->u,dVar1);
  dVar1 = vec3::y((vec3 *)local_38);
  operator*(&local_98,&this->v,dVar1);
  operator+((vec3 *)local_68,&local_80,&local_98);
  operator+(&local_b0,&this->origin,(vec3 *)local_68);
  operator*(&local_128,s,&this->horizontal);
  operator+(&local_110,&this->lower_left_corner,&local_128);
  operator*(&local_140,rd.e[2],&this->vertical);
  operator+(&local_f8,&local_110,&local_140);
  operator-(&local_e0,&local_f8,&this->origin);
  operator-(&local_c8,&local_e0,(vec3 *)local_68);
  dVar1 = random_double(this->time0,this->time1);
  ray::ray(__return_storage_ptr__,&local_b0,&local_c8,dVar1);
  return __return_storage_ptr__;
}

Assistant:

ray get_ray(double s, double t) {
        vec3 rd = lens_radius * random_in_unit_disk();
        vec3 offset = u * rd.x() + v * rd.y();

        return ray(
                origin + offset,
                lower_left_corner + s * horizontal + t * vertical - origin - offset,
                random_double(time0, time1)
                );
    }